

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  Rgba *pRVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  TiledInputFile *in_RDI;
  int in_R8D;
  int x1_1;
  int x;
  int x1;
  int y1;
  int y;
  int width;
  Box2i dw;
  stringstream _iex_throw_s;
  Data **in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffdf8;
  TiledInputFile *in_stack_fffffffffffffe00;
  Rgba *in_stack_fffffffffffffe08;
  Rgba *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  TiledInputFile *this_01;
  
  if (in_RDI[6].super_GenericInputFile._vptr_GenericInputFile == (_func_int **)0x0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,
                             "No frame buffer was specified as the pixel data destination for image file \""
                            );
    pcVar3 = TiledInputFile::fileName((TiledInputFile *)0x1af24e);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  this_01 = in_RDI;
  TiledInputFile::readTile
            (in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (int)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0);
  TiledInputFile::dataWindowForTile(this_01,in_ESI,in_EDX,in_ECX,in_R8D);
  iVar1 = (local_1b4 - local_1bc) + 1;
  local_1c8 = 0;
  for (local_1c4 = local_1b8; local_1c4 <= local_1b0; local_1c4 = local_1c4 + 1) {
    for (local_1cc = 0; local_1cc < iVar1; local_1cc = local_1cc + 1) {
      Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&in_RDI[4]._data,(long)local_1c8)
      ;
      half::operator=((half *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&in_RDI[4]._data,(long)local_1c8)
      ;
      half::operator=((half *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    }
    in_stack_fffffffffffffde8 = &in_RDI[3]._data;
    in_stack_fffffffffffffdf4 = iVar1;
    Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&in_RDI[4]._data,(long)local_1c8);
    Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)&in_RDI[4]._data,(long)local_1c8);
    RgbaYca::YCAtoRGBA((V3f *)in_RDI,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                       in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_1d4 = 0;
    for (local_1d0 = local_1bc; local_1d0 <= local_1b4; local_1d0 = local_1d0 + 1) {
      pRVar4 = Array2D<Imf_2_5::Rgba>::operator[]
                         ((Array2D<Imf_2_5::Rgba> *)&in_RDI[4]._data,(long)local_1c8);
      *(Rgba *)(in_RDI[6].super_GenericInputFile._vptr_GenericInputFile +
               (long)local_1d0 * (long)in_RDI[6]._data +
               (long)local_1c4 * (long)in_RDI[7].super_GenericInputFile._vptr_GenericInputFile) =
           pRVar4[local_1d4];
      local_1d4 = local_1d4 + 1;
    }
    local_1c8 = local_1c8 + 1;
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data destination for image file "
			    "\"" << _inputFile.fileName() << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //
    
    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i dw = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int width = dw.max.x - dw.min.x + 1;

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
	for (int x1 = 0; x1 < width; ++x1)
	{
	    _buf[y1][x1].r = 0;
	    _buf[y1][x1].b = 0;
	}

	YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

	for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
	{
	    _fbBase[x * _fbXStride + y * _fbYStride] = _buf[y1][x1];
	}
    }
}